

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_line.hpp
# Opt level: O2

void __thiscall Args::CmdLine::parse(CmdLine *this)

{
  Command **__x;
  Command **__x_00;
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  pointer ppCVar3;
  Command *pCVar4;
  bool bVar5;
  pointer ppAVar6;
  size_type sVar7;
  bool bVar8;
  int iVar9;
  ArgIface *pAVar10;
  __normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
  _Var11;
  BaseException *pBVar12;
  ulong uVar13;
  pointer ppAVar14;
  pointer ppCVar15;
  bool valuePrepended;
  allocator local_199;
  long local_198;
  Context *local_190;
  ArgIface *tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  String value;
  vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> tmpArgs;
  String word;
  ArgIface *arg;
  anon_class_24_3_c2b40766 check;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  clear(this);
  checkCorrectnessBeforeParsing(this);
  local_190 = &this->m_context;
  __x = &this->m_currCommand;
  __x_00 = &this->m_command;
  do {
    pbVar2 = (this->m_context).m_it._M_current;
    if (pbVar2 == (this->m_context).m_context.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      checkCorrectnessAfterParsing(this);
      return;
    }
    (this->m_context).m_it._M_current = pbVar2 + 1;
    std::__cxx11::string::string((string *)&word,(string *)pbVar2);
    valuePrepended = false;
    local_198 = std::__cxx11::string::find((char)&word,0x3d);
    if (local_198 != -1) {
      std::__cxx11::string::substr((ulong)&value,(ulong)&word);
      valuePrepended = value._M_string_length != 0;
      if (valuePrepended) {
        Context::prepend(local_190,&value);
      }
      std::__cxx11::string::substr((ulong)&local_160,(ulong)&word);
      std::__cxx11::string::operator=((string *)&word,(string *)&local_160);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&value);
    }
    bVar8 = details::isArgument(&word);
    if (bVar8) {
      pAVar10 = findArgument(this,&word);
      if (pAVar10 == (ArgIface *)0x0) {
        if ((this->m_opt & 2) == 0) {
          printInfoAboutUnknownArgument(this,&word);
        }
        else {
          savePositionalArguments(this,&word,local_198 != -1,valuePrepended);
        }
      }
      else {
        (*pAVar10->_vptr_ArgIface[0xf])(pAVar10,local_190);
      }
    }
    else {
      bVar8 = details::isFlag(&word);
      sVar7 = word._M_string_length;
      if (bVar8) {
        tmpArgs.super__Vector_base<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        tmpArgs.super__Vector_base<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        tmpArgs.super__Vector_base<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar1 = word._M_string_length - 1;
        bVar8 = false;
        uVar13 = 1;
        do {
          if (sVar7 <= uVar13) break;
          std::__cxx11::string::string((string *)&local_160,"-",(allocator *)&arg);
          local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_180,'\x01');
          std::operator+(&value,&local_160,&local_180);
          std::__cxx11::string::~string((string *)&local_180);
          std::__cxx11::string::~string((string *)&local_160);
          arg = findArgument(this,&value);
          if (arg == (ArgIface *)0x0) {
            if ((this->m_opt & 2) == 0) {
              pBVar12 = (BaseException *)__cxa_allocate_exception(0x30);
              std::__cxx11::string::string
                        ((string *)&local_180,"Unknown argument \"",(allocator *)&check);
              std::operator+(&local_160,&local_180,&value);
              std::operator+(&local_50,&local_160,"\".");
              BaseException::BaseException(pBVar12,&local_50);
              __cxa_throw(pBVar12,&BaseException::typeinfo,BaseException::~BaseException);
            }
LAB_0012dd8c:
            bVar8 = true;
            bVar5 = false;
          }
          else {
            std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>::push_back
                      (&tmpArgs,&arg);
            if ((uVar13 < uVar1) && (iVar9 = (*arg->_vptr_ArgIface[4])(), (char)iVar9 != '\0')) {
              if ((this->m_opt & 2) == 0) {
                pBVar12 = (BaseException *)__cxa_allocate_exception(0x30);
                std::__cxx11::string::string
                          ((string *)&local_180,
                           "Only last argument in flags combo can be with value. Flags combo is \"",
                           (allocator *)&check);
                std::operator+(&local_160,&local_180,&word);
                std::operator+(&local_70,&local_160,"\".");
                BaseException::BaseException(pBVar12,&local_70);
                __cxa_throw(pBVar12,&BaseException::typeinfo,BaseException::~BaseException);
              }
              goto LAB_0012dd8c;
            }
            bVar5 = true;
            (*arg->_vptr_ArgIface[0xf])(arg,local_190);
          }
          std::__cxx11::string::~string((string *)&value);
          uVar13 = uVar13 + 1;
        } while (bVar5);
        ppAVar6 = tmpArgs.super__Vector_base<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if ((bVar8) &&
           (ppAVar14 = tmpArgs.
                       super__Vector_base<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>.
                       _M_impl.super__Vector_impl_data._M_start, (this->m_opt & 2) != 0)) {
          for (; ppAVar14 != ppAVar6; ppAVar14 = ppAVar14 + 1) {
            (*(*ppAVar14)->_vptr_ArgIface[0xd])();
          }
          savePositionalArguments(this,&word,local_198 != -1,valuePrepended);
        }
        std::_Vector_base<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>::~_Vector_base
                  (&tmpArgs.super__Vector_base<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>)
        ;
      }
      else {
        tmp = findArgument(this,&word);
        check.tmp = &tmp;
        check.this = this;
        check.word = &word;
        if ((tmp == (ArgIface *)0x0) || (iVar9 = (*tmp->_vptr_ArgIface[2])(tmp), iVar9 != 0)) {
          if ((this->m_opt & 2) == 0) {
            printInfoAboutUnknownArgument(this,&word);
          }
          else {
            savePositionalArguments(this,&word,local_198 != -1,valuePrepended);
          }
        }
        else {
          ppCVar15 = (this->m_prevCommand).
                     super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          ppCVar3 = (this->m_prevCommand).
                    super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          if (ppCVar15 != ppCVar3) {
            for (; ppCVar15 != ppCVar3; ppCVar15 = ppCVar15 + 1) {
              pCVar4 = *ppCVar15;
              _Var11 = std::
                       __find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>const*,std::vector<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,std::allocator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>>>,__gnu_cxx::__ops::_Iter_pred<Args::CmdLine::parse()::_lambda(auto:1_const&)_1_>>
                                 ((pCVar4->super_GroupIface).m_children.
                                  super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (pCVar4->super_GroupIface).m_children.
                                  super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,&tmp);
              if ((_Var11._M_current !=
                   (pCVar4->super_GroupIface).m_children.
                   super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) &&
                 (pAVar10 = Command::findChild(*__x,&word), pAVar10 == (ArgIface *)0x0)) {
                pBVar12 = (BaseException *)__cxa_allocate_exception(0x30);
                std::__cxx11::string::string
                          ((string *)&tmpArgs,
                           "Only one command from one level can be specified. But you defined \"",
                           &local_199);
                std::operator+(&local_180,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &tmpArgs,&word);
                std::operator+(&local_160,&local_180,"\" and \"");
                (*((*ppCVar15)->super_GroupIface).super_ArgIface._vptr_ArgIface[3])(&arg);
                std::operator+(&value,&local_160,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &arg);
                std::operator+(&local_90,&value,"\".");
                BaseException::BaseException(pBVar12,&local_90);
                __cxa_throw(pBVar12,&BaseException::typeinfo,BaseException::~BaseException);
              }
            }
          }
          parse::anon_class_24_3_c2b40766::operator()(&check);
          if (*__x_00 == (Command *)0x0) {
            *__x_00 = (Command *)tmp;
            *__x = (Command *)tmp;
            std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>::push_back
                      (&this->m_prevCommand,__x_00);
            (*((*__x_00)->super_GroupIface).super_ArgIface._vptr_ArgIface[0xf])(*__x_00,local_190);
          }
          else {
            (*__x)->m_subCommand = (Command *)tmp;
            *__x = (Command *)tmp;
            std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>::push_back
                      (&this->m_prevCommand,__x);
            (*((*__x)->super_GroupIface).super_ArgIface._vptr_ArgIface[0xf])(*__x,local_190);
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&word);
  } while( true );
}

Assistant:

inline void
CmdLine::parse()
{
	clear();

	checkCorrectnessBeforeParsing();

	while( !m_context.atEnd() )
	{
		String word = *m_context.next();

		const String::size_type eqIt = word.find( '=' );

		bool splitted = false;
		bool valuePrepended = false;

		if( eqIt != String::npos )
		{
			splitted = true;

			const String value = word.substr( eqIt + 1 );

			if( !value.empty() )
			{
				valuePrepended = true;
				m_context.prepend( value );
			}

			word = word.substr( 0, eqIt );
		}

		if( details::isArgument( word ) )
		{
			auto * arg = findArgument( word );

			if( arg )
				arg->process( m_context );
			else if( m_opt & HandlePositionalArguments )
				savePositionalArguments( word, splitted, valuePrepended );
			else
				printInfoAboutUnknownArgument( word );
		}
		else if( details::isFlag( word ) )
		{
			std::vector< ArgIface* > tmpArgs;
			bool failed = false;

			for( String::size_type i = 1, length = word.length(); i < length; ++i )
			{
				const String flag = String( SL( "-" ) ) +

#ifdef ARGS_QSTRING_BUILD
					String( word[ i ] );
#else
					String( 1, word[ i ] );
#endif

				auto * arg = findArgument( flag );

				if( !arg )
				{
					failed = true;

					if( !( m_opt & HandlePositionalArguments ) )
						throw BaseException( String( SL( "Unknown argument \"" ) ) +
							flag + SL( "\"." ) );
					else
						break;
				}
				else
					tmpArgs.push_back( arg );

				if( i < length - 1 && arg->isWithValue() )
				{
					failed = true;

					if( !( m_opt & HandlePositionalArguments ) )
						throw BaseException( String( SL( "Only last argument in "
							"flags combo can be with value. Flags combo is \"" ) ) +
							word + SL( "\"." ) );
					else
						break;
				}
				else
					arg->process( m_context );
			}

			if( failed && ( m_opt & HandlePositionalArguments ) )
			{
				for( auto * a : tmpArgs )
					a->clear();

				savePositionalArguments( word, splitted, valuePrepended );
			}
		}
		// Command?
		else
		{
			auto * tmp = findArgument( word );

			auto check = [this, &tmp, &word] ()
			{
				const auto & args = m_args;

				const auto it = std::find_if( args.cbegin(),
					args.cend(), [&tmp] ( const auto & arg ) -> bool
						{ return ( arg.get() == tmp ); } );

				if( m_command && it != args.cend() && !m_command->findChild( word ) )
					throw BaseException( String( SL(
							"Only one command from one level can be specified. "
							"But you defined \"" ) ) +
						word + SL( "\" and \"" ) + m_command->name() + SL( "\"." ) );
			};

			if( tmp )
			{
				if( tmp->type() == ArgType::Command )
				{
					bool stopProcessing = false;

					try {
						if( !m_prevCommand.empty() )
						{
							for( const auto & prev : m_prevCommand )
							{
								const auto & args = prev->children();

								const auto it = std::find_if( args.cbegin(),
									args.cend(), [&tmp] ( const auto & arg ) -> bool
										{ return ( arg.get() == tmp ); } );

								if( it != args.cend() && !m_currCommand->findChild( word ) )
									throw BaseException( String( SL(
											"Only one command from one level can be specified. "
											"But you defined \"" ) ) +
										word + SL( "\" and \"" ) + prev->name() + SL( "\"." ) );
							}

							check();
						}
						else
							check();
					}
					catch( const BaseException & )
					{
						if( m_opt & HandlePositionalArguments )
						{
							savePositionalArguments( word, splitted, valuePrepended );

							stopProcessing = true;
						}
						else
							throw;
					}

					if( stopProcessing )
						continue;

					if( !m_command )
					{
						m_command = static_cast< Command* > ( tmp );

						m_currCommand = m_command;

						m_prevCommand.push_back( m_command );

						m_command->process( m_context );
					}
					else
					{
						auto * cmd = static_cast< Command* > ( tmp );

						m_currCommand->setCurrentSubCommand( cmd );

						m_currCommand = cmd;

						m_prevCommand.push_back( m_currCommand );

						m_currCommand->process( m_context );
					}
				}
				else if( m_opt & HandlePositionalArguments )
					savePositionalArguments( word, splitted, valuePrepended );
				else
					printInfoAboutUnknownArgument( word );
			}
			else if( m_opt & HandlePositionalArguments )
				savePositionalArguments( word, splitted, valuePrepended );
			else
				printInfoAboutUnknownArgument( word );
		}
	}

	checkCorrectnessAfterParsing();
}